

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void http_exp100_send_anyway(Curl_easy *data)

{
  Curl_creader *pCVar1;
  
  pCVar1 = Curl_creader_get_by_type(data,&cr_exp100);
  if ((pCVar1 != (Curl_creader *)0x0) && (*(int *)((long)pCVar1->ctx + 0x30) != 0)) {
    *(undefined4 *)((long)pCVar1->ctx + 0x30) = 0;
    (data->req).keepon = (data->req).keepon & 0xffffffbdU | 2;
    Curl_expire_done(data,EXPIRE_100_TIMEOUT);
    return;
  }
  return;
}

Assistant:

static void http_exp100_send_anyway(struct Curl_easy *data)
{
  struct Curl_creader *r = Curl_creader_get_by_type(data, &cr_exp100);
  if(r)
    http_exp100_continue(data, r);
}